

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueue.h
# Opt level: O0

void __thiscall
rigtorp::SPSCQueue<int,_std::allocator<int>_>::pop(SPSCQueue<int,_std::allocator<int>_> *this)

{
  __int_type _Var1;
  size_t local_70;
  __int_type nextReadIdx;
  __int_type readIdx;
  SPSCQueue<int,_std::allocator<int>_> *this_local;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_2;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  _Var1 = (this->readIdx_).super___atomic_base<unsigned_long>._M_i;
  std::operator&(memory_order_acquire,__memory_order_mask);
  if ((this->writeIdx_).super___atomic_base<unsigned_long>._M_i == _Var1) {
    __assert_fail("writeIdx_.load(std::memory_order_acquire) != readIdx && \"Can only call pop() after front() has returned a non-nullptr\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/rigtorp[P]SPSCQueue/include/rigtorp/SPSCQueue.h"
                  ,0xb8,
                  "void rigtorp::SPSCQueue<int>::pop() [T = int, Allocator = std::allocator<int>]");
  }
  local_70 = _Var1 + 1;
  if (local_70 == this->capacity_) {
    local_70 = 0;
  }
  std::operator&(memory_order_release,__memory_order_mask);
  (this->readIdx_).super___atomic_base<unsigned_long>._M_i = local_70;
  return;
}

Assistant:

void pop() noexcept {
    static_assert(std::is_nothrow_destructible<T>::value,
                  "T must be nothrow destructible");
    auto const readIdx = readIdx_.load(std::memory_order_relaxed);
    assert(writeIdx_.load(std::memory_order_acquire) != readIdx &&
           "Can only call pop() after front() has returned a non-nullptr");
    slots_[readIdx + kPadding].~T();
    auto nextReadIdx = readIdx + 1;
    if (nextReadIdx == capacity_) {
      nextReadIdx = 0;
    }
    readIdx_.store(nextReadIdx, std::memory_order_release);
  }